

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

void __thiscall spvtools::Optimizer::Impl::Impl(Impl *this,spv_target_env env)

{
  spv_target_env env_local;
  Impl *this_local;
  
  this->target_env = env;
  opt::PassManager::PassManager(&this->pass_manager);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&this->live_locs);
  return;
}

Assistant:

explicit Impl(spv_target_env env) : target_env(env), pass_manager() {}